

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_ncasecmp(char *s1,char *s2,size_t len)

{
  int iVar1;
  bool bVar2;
  int local_24;
  size_t sStack_20;
  int diff;
  size_t len_local;
  char *s2_local;
  char *s1_local;
  
  local_24 = 0;
  sStack_20 = len;
  len_local = (size_t)s2;
  s2_local = s1;
  if (len != 0) {
    do {
      local_24 = lowercase(s2_local);
      iVar1 = lowercase((char *)len_local);
      local_24 = local_24 - iVar1;
      bVar2 = false;
      if ((local_24 == 0) && (bVar2 = false, *s2_local != '\0')) {
        sStack_20 = sStack_20 - 1;
        bVar2 = sStack_20 != 0;
      }
      len_local = len_local + 1;
      s2_local = s2_local + 1;
    } while (bVar2);
  }
  return local_24;
}

Assistant:

int mg_ncasecmp(const char *s1, const char *s2, size_t len) {
    int diff = 0;

    if (len > 0)
        do {
            diff = lowercase(s1++) - lowercase(s2++);
        } while (diff == 0 && s1[-1] != '\0' && --len > 0);

    return diff;
}